

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KFIXED.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = (ostream *)
           std::ostream::operator<<(local_188,(float)(int)*(short *)((long)this + 8) * 0.00390625);
  std::operator<<(poVar1,"\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

KString KFIXED<Type, BinaryPoint>::GetAsString() const
{
    KStringStream ss;

    ss << GetAsFloat32() << "\n";

    return ss.str();
}